

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_NotifyUploadCompletion
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *uploadCorrelationId,_Bool isSuccess
          ,int responseCode,char *responseMessage)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  
  if (iotHubClientHandle != (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                      (iotHubClientHandle->uploadToBlobHandle,uploadCorrelationId,isSuccess,
                       responseCode,responseMessage);
    return IVar1;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"IoTHubClientCore_LL_NotifyUploadCompletion",0xbf6,1,
              "invalid parameter iotHubClientHandle=%p",0);
  }
  return IOTHUB_CLIENT_INVALID_ARG;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_NotifyUploadCompletion(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* uploadCorrelationId, bool isSuccess, int responseCode, const char* responseMessage)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        LogError("invalid parameter iotHubClientHandle=%p", iotHubClientHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_NotifyCompletion(iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, isSuccess, responseCode, responseMessage);
    }

    return result;
}